

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::Promise<unsigned_long>::attach<kj::OwnFd,kj::OwnFd>
          (Promise<unsigned_long> *this,OwnFd *attachments,OwnFd *attachments_1)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *next;
  OwnFd *params;
  OwnFd *params_1;
  PromiseArena *in_RCX;
  undefined1 local_40 [8];
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::OwnFd,_kj::OwnFd>_>,_kj::_::PromiseDisposer>
  local_38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_30;
  PromiseArena *local_28;
  OwnFd *attachments_local_1;
  OwnFd *attachments_local;
  Promise<unsigned_long> *this_local;
  
  local_28 = in_RCX;
  attachments_local_1 = attachments_1;
  attachments_local = attachments;
  this_local = this;
  next = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>
                   ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)attachments);
  params = fwd<kj::OwnFd>(attachments_local_1);
  params_1 = fwd<kj::OwnFd>((NoInfer<kj::OwnFd> *)local_28);
  tuple<kj::OwnFd,kj::OwnFd>((kj *)local_40,params,params_1);
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::OwnFd,kj::OwnFd>>,kj::_::PromiseDisposer,kj::_::Tuple<kj::OwnFd,kj::OwnFd>>
            ((PromiseDisposer *)&local_38,next,(Tuple<kj::OwnFd,_kj::OwnFd> *)local_40);
  Own<kj::_::PromiseNode,kj::_::PromiseDisposer>::
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::OwnFd,kj::OwnFd>>,void>
            ((Own<kj::_::PromiseNode,kj::_::PromiseDisposer> *)&local_30,&local_38);
  Promise(this,false,(OwnPromiseNode *)&local_30);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(&local_30);
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::OwnFd,_kj::OwnFd>_>,_kj::_::PromiseDisposer>::
  ~Own(&local_38);
  kj::_::Tuple<kj::OwnFd,_kj::OwnFd>::~Tuple((Tuple<kj::OwnFd,_kj::OwnFd> *)local_40);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}